

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O2

void __thiscall
first_fit_heap<256UL>::free_list_container::free_list_container
          (free_list_container *this,memory *mem_,header_free *root)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 *puVar4;
  
  this->mem = mem_;
  this->list = root;
  iVar1 = (*mem_->_vptr_memory[3])(mem_);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*this->mem->_vptr_memory[2])();
    if ((char)iVar1 == '\0') {
      iVar1 = (*this->mem->_vptr_memory[2])();
      iVar2 = (*this->mem->_vptr_memory[3])();
      iVar3 = (*this->mem->_vptr_memory[2])();
      if (CONCAT44(extraout_var_02,iVar3) <
          (ulong)(CONCAT44(extraout_var_01,iVar2) + CONCAT44(extraout_var_00,iVar1))) {
        return;
      }
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &__cxxabiv1::__si_class_type_info::vtable;
  __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

free_list_container(memory &mem_, header_free *root) : mem(mem_), list(root)
        {
            ASSERT_HEAP(ALIGNMENT != 0);
            ASSERT_HEAP(ALIGNMENT >= min_alignment());
            ASSERT_HEAP((ALIGNMENT & (ALIGNMENT - 1)) == 0);
            ASSERT_HEAP(sizeof(header_used) == ALIGNMENT);
            ASSERT_HEAP(mem.size() != 0);
            ASSERT_HEAP((mem.base() & (ALIGNMENT - 1)) == 0);
            ASSERT_HEAP((mem.base() + mem.size()) > mem.base());
        }